

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debuginfo.cpp
# Opt level: O2

int32_t __thiscall DebugInfo::GetObjectFileIndex(DebugInfo *this,char *pathStr)

{
  iterator __pos;
  long lVar1;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *this_00;
  _Rb_tree_color _Var2;
  string path;
  string file;
  string dir;
  ObjectFileInfo info;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_58;
  
  std::__cxx11::string::string((string *)&path,pathStr,(allocator *)&info);
  __pos = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          ::find(&(this->m_ObjectPathToIndex)._M_t,&path);
  if ((_Rb_tree_header *)__pos._M_node ==
      &(this->m_ObjectPathToIndex)._M_t._M_impl.super__Rb_tree_header) {
    dir._M_dataplus._M_p = (pointer)&dir.field_2;
    dir._M_string_length = 0;
    dir.field_2._M_local_buf[0] = '\0';
    file._M_dataplus._M_p = (pointer)&file.field_2;
    file._M_string_length = 0;
    file.field_2._M_local_buf[0] = '\0';
    lVar1 = std::__cxx11::string::find_last_of((char *)&path,0x10c2cc);
    if (lVar1 == -1) {
      std::__cxx11::string::assign((char *)&dir);
      std::__cxx11::string::_M_assign((string *)&file);
    }
    else {
      std::__cxx11::string::substr((ulong)&info,(ulong)&path);
      std::__cxx11::string::operator=((string *)&dir,(string *)&info);
      std::__cxx11::string::~string((string *)&info);
      std::__cxx11::string::substr((ulong)&info,(ulong)&path);
      std::__cxx11::string::operator=((string *)&file,(string *)&info);
      std::__cxx11::string::~string((string *)&info);
    }
    info.fileDir._M_dataplus._M_p = (pointer)&info.fileDir.field_2;
    info.fileDir._M_string_length = 0;
    info.fileDir.field_2._M_local_buf[0] = '\0';
    info.fileName._M_dataplus._M_p = (pointer)&info.fileName.field_2;
    info.fileName._M_string_length = 0;
    info.fileName.field_2._M_local_buf[0] = '\0';
    info.index = 0;
    info.codeSize = 0;
    info.dataSize = 0;
    info.contribCodeSize = 0;
    info.contribDataSize = 0;
    std::__cxx11::string::_M_assign((string *)&info);
    std::__cxx11::string::_M_assign((string *)&info.fileName);
    _Var2 = (_Rb_tree_color)
            (this->m_ObjectPathToIndex)._M_t._M_impl.super__Rb_tree_header._M_node_count;
    info.index = _Var2;
    std::vector<ObjectFileInfo,std::allocator<ObjectFileInfo>>::emplace_back<ObjectFileInfo&>
              ((vector<ObjectFileInfo,std::allocator<ObjectFileInfo>> *)&this->m_ObjectFiles,&info);
    std::__cxx11::string::string((string *)&local_58,(string *)&path);
    local_58.second = _Var2;
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
    ::_M_insert_unique_<std::pair<std::__cxx11::string_const,int>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
                *)&this->m_ObjectPathToIndex,(const_iterator)__pos._M_node,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    this_00 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
               *)std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                 ::operator[](&this->m_ObjectNameToFolders,&file);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string_const&>(this_00,&dir);
    ObjectFileInfo::~ObjectFileInfo(&info);
    std::__cxx11::string::~string((string *)&file);
    std::__cxx11::string::~string((string *)&dir);
  }
  else {
    _Var2 = __pos._M_node[2]._M_color;
  }
  std::__cxx11::string::~string((string *)&path);
  return _Var2;
}

Assistant:

int32_t DebugInfo::GetObjectFileIndex(const char* pathStr)
{
    std::string path = pathStr;
    auto it = m_ObjectPathToIndex.find(path);
    if (it != m_ObjectPathToIndex.end())
        return it->second;

    std::string dir, file;
    splitPath(path, dir, file);

    ObjectFileInfo info;
    info.fileDir = dir;
    info.fileName = file;

    int32_t index = int32_t(m_ObjectPathToIndex.size());
    info.index = index;

    m_ObjectFiles.emplace_back(info);
    m_ObjectPathToIndex.insert(it, {path, index});
    m_ObjectNameToFolders[file].insert(dir);
    return index;
}